

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

MockSpec<void_(solitaire::graphics::TextureId,_unsigned_char)> * __thiscall
testing::internal::FunctionMocker<void_(solitaire::graphics::TextureId,_unsigned_char)>::With
          (MockSpec<void_(solitaire::graphics::TextureId,_unsigned_char)> *__return_storage_ptr__,
          FunctionMocker<void_(solitaire::graphics::TextureId,_unsigned_char)> *this,
          Matcher<solitaire::graphics::TextureId> *m,Matcher<unsigned_char> *m_1)

{
  _Tuple_impl<0UL,_testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<unsigned_char>_>
  local_40;
  
  local_40.super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.vtable_ = (m_1->super_MatcherBase<unsigned_char>).vtable_;
  local_40.super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.buffer_ = (m_1->super_MatcherBase<unsigned_char>).buffer_;
  (m_1->super_MatcherBase<unsigned_char>).vtable_ = (VTable *)0x0;
  local_40.super__Tuple_impl<1UL,_testing::Matcher<unsigned_char>_>.
  super__Head_base<1UL,_testing::Matcher<unsigned_char>,_false>._M_head_impl.
  super_MatcherBase<unsigned_char>.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00324c30;
  local_40.super__Head_base<0UL,_testing::Matcher<solitaire::graphics::TextureId>,_false>.
  _M_head_impl.super_MatcherBase<solitaire::graphics::TextureId>.vtable_ =
       (m->super_MatcherBase<solitaire::graphics::TextureId>).vtable_;
  local_40.super__Head_base<0UL,_testing::Matcher<solitaire::graphics::TextureId>,_false>.
  _M_head_impl.super_MatcherBase<solitaire::graphics::TextureId>.buffer_ =
       (m->super_MatcherBase<solitaire::graphics::TextureId>).buffer_;
  (m->super_MatcherBase<solitaire::graphics::TextureId>).vtable_ = (VTable *)0x0;
  local_40.super__Head_base<0UL,_testing::Matcher<solitaire::graphics::TextureId>,_false>.
  _M_head_impl.super_MatcherBase<solitaire::graphics::TextureId>.super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_00325e48;
  __return_storage_ptr__->function_mocker_ = this;
  std::
  _Tuple_impl<0UL,_testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<unsigned_char>_>
  ::_Tuple_impl(&(__return_storage_ptr__->matchers_).
                 super__Tuple_impl<0UL,_testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<unsigned_char>_>
                ,&local_40);
  MatcherBase<solitaire::graphics::TextureId>::~MatcherBase
            ((MatcherBase<solitaire::graphics::TextureId> *)
             &local_40.
              super__Head_base<0UL,_testing::Matcher<solitaire::graphics::TextureId>,_false>);
  MatcherBase<unsigned_char>::~MatcherBase((MatcherBase<unsigned_char> *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

MockSpec<F> With(Matcher<Args>... m) {
    return MockSpec<F>(this, ::std::make_tuple(std::move(m)...));
  }